

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThriftSenderTest.cpp
# Opt level: O2

void __thiscall
jaegertracing::ThriftSender_testExceptions_Test::TestBody(ThriftSender_testExceptions_Test *this)

{
  char cVar1;
  UDPTransporter *this_00;
  string_view name;
  allocator local_351;
  time_point local_350;
  string local_348;
  vector<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_> local_328;
  undefined8 local_308;
  shared_ptr<const_jaegertracing::Tracer> tracer;
  shared_ptr<jaegertracing::testutils::TracerUtil::ResourceHandle> handle;
  time_point local_2e0;
  IPAddress local_2d8;
  MockThriftSender mockSender;
  Span span;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_198 [45];
  
  jaegertracing::testutils::TracerUtil::installGlobalTracer();
  opentracing::v3::Tracer::Global();
  std::static_pointer_cast<jaegertracing::Tracer_const,opentracing::v3::Tracer>
            ((shared_ptr<opentracing::v3::Tracer> *)&tracer);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_198);
  mockSender._48_8_ = &mockSender.field_0x60;
  mockSender._0_8_ = &PTR__SpanContext_0021e2e8;
  mockSender._8_8_ = 0;
  mockSender._16_8_ = 0;
  mockSender._24_8_ = 0;
  mockSender._32_8_ = 0;
  mockSender._40_1_ = 0;
  mockSender._56_8_ = 1;
  mockSender._64_8_ = 0;
  mockSender._72_8_ = 0;
  mockSender._80_4_ = 0x3f800000;
  mockSender._88_8_ = 0;
  mockSender._96_8_ = 0;
  mockSender._104_8_ = &mockSender.field_0x78;
  mockSender._112_8_ = 0;
  mockSender._120_1_ = 0;
  mockSender._136_8_ = 0;
  mockSender._144_8_ = 0;
  std::__cxx11::string::string((string *)&local_2d8,"",&local_351);
  local_350.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_2e0.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  local_348._M_dataplus._M_p = (pointer)0x0;
  local_348._M_string_length = 0;
  local_348.field_2._M_allocated_capacity = 0;
  local_328.super__Vector_base<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_328.super__Vector_base<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_328.super__Vector_base<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Span::Span(&span,&tracer,(SpanContext *)&mockSender,(string *)&local_2d8,&local_350,&local_2e0,
             (vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)&local_348,
             &local_328);
  std::vector<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_>::~vector
            (&local_328);
  std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector
            ((vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)&local_348);
  std::__cxx11::string::~string((string *)&local_2d8);
  SpanContext::~SpanContext((SpanContext *)&mockSender);
  name.length_ = 4;
  name.data_ = "test";
  Span::SetOperationName(&span,name);
  local_308 = 0;
  std::__cxx11::string::string((string *)&local_348,"localhost",(allocator *)&local_350);
  net::IPAddress::v4(&local_2d8,&local_348,0);
  this_00 = (UDPTransporter *)operator_new(200);
  jaegertracing::utils::UDPTransporter::UDPTransporter(this_00,&local_2d8,0);
  (this_00->super_Transport)._vptr_Transport = (_func_int **)&PTR__UDPTransporter_0021f4f0;
  *(undefined4 *)&this_00[1].super_Transport._vptr_Transport = 0;
  local_328.super__Vector_base<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)this_00;
  jaegertracing::ThriftSender::ThriftSender(&mockSender.super_ThriftSender,(unique_ptr *)&local_328)
  ;
  if ((UDPTransporter *)
      local_328.
      super__Vector_base<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_>.
      _M_impl.super__Vector_impl_data._M_start != (UDPTransporter *)0x0) {
    (*((Transport *)
      &(local_328.
        super__Vector_base<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_>.
        _M_impl.super__Vector_impl_data._M_start)->_spanContext)->_vptr_Transport[1])();
  }
  mockSender._0_8_ = &PTR__ThriftSender_0021f4a0;
  std::__cxx11::string::~string((string *)&local_348);
  jaegertracing::ThriftSender::append((Span *)&mockSender.super_ThriftSender);
  cVar1 = testing::internal::AlwaysTrue();
  if (cVar1 != '\0') {
    jaegertracing::ThriftSender::flush();
  }
  testing::Message::Message((Message *)&local_2d8);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_348,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/ThriftSenderTest.cpp"
             ,0x69,
             "Expected: mockSender.flush() throws an exception of type Sender::Exception.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_348,(Message *)&local_2d8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_348);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_2d8);
  ThriftSender::~ThriftSender(&mockSender.super_ThriftSender);
  Span::~Span(&span);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&tracer.super___shared_ptr<const_jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&handle.
              super___shared_ptr<jaegertracing::testutils::TracerUtil::ResourceHandle,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

TEST(ThriftSender, testExceptions)
{
    const auto handle = testutils::TracerUtil::installGlobalTracer();
    const auto tracer =
        std::static_pointer_cast<const Tracer>(opentracing::Tracer::Global());

    Span span(tracer);
    span.SetOperationName("test");

    const MockUDPSender::ExceptionType exceptionTypes[] = {
        MockUDPSender::ExceptionType::kSystemError,
        MockUDPSender::ExceptionType::kException,
        MockUDPSender::ExceptionType::kString
    };
    for (auto type : exceptionTypes) {
      MockThriftSender mockSender(net::IPAddress::v4("localhost", 0), 0, type);
      mockSender.append(span);
        ASSERT_THROW(mockSender.flush(), Sender::Exception);
    }
}